

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stop.c
# Opt level: O0

int equal_stop(stop_t *a,stop_t *b)

{
  int iVar1;
  bool local_19;
  stop_t *b_local;
  stop_t *a_local;
  
  iVar1 = strcmp(a->id,b->id);
  local_19 = false;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->code,b->code);
    local_19 = false;
    if (iVar1 == 0) {
      iVar1 = strcmp(a->name,b->name);
      local_19 = false;
      if (iVar1 == 0) {
        iVar1 = strcmp(a->desc,b->desc);
        local_19 = false;
        if (iVar1 == 0) {
          iVar1 = strcmp(a->zone_id,b->zone_id);
          local_19 = false;
          if (iVar1 == 0) {
            iVar1 = strcmp(a->url,b->url);
            local_19 = false;
            if (iVar1 == 0) {
              iVar1 = strcmp(a->parent_station,b->parent_station);
              local_19 = false;
              if (iVar1 == 0) {
                iVar1 = strcmp(a->timezone,b->timezone);
                local_19 = false;
                if (iVar1 == 0) {
                  iVar1 = strcmp(a->level_id,b->level_id);
                  local_19 = false;
                  if (iVar1 == 0) {
                    iVar1 = strcmp(a->platform_code,b->platform_code);
                    local_19 = false;
                    if (iVar1 == 0) {
                      local_19 = false;
                      if ((a->lat == b->lat) && (!NAN(a->lat) && !NAN(b->lat))) {
                        local_19 = false;
                        if ((a->lon == b->lon) &&
                           ((!NAN(a->lon) && !NAN(b->lon) &&
                            (local_19 = false, a->location_type == b->location_type)))) {
                          local_19 = a->wheelchair_boarding == b->wheelchair_boarding;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (int)local_19;
}

Assistant:

int equal_stop(const stop_t *a, const stop_t *b) {
    return (!strcmp(a->id, b->id) &&
             !strcmp(a->code, b->code) &&
             !strcmp(a->name, b->name) &&
             !strcmp(a->desc, b->desc) &&
             !strcmp(a->zone_id, b->zone_id) &&
             !strcmp(a->url, b->url) &&
             !strcmp(a->parent_station, b->parent_station) &&
             !strcmp(a->timezone, b->timezone) &&
             !strcmp(a->level_id, b->level_id) &&
             !strcmp(a->platform_code, b->platform_code) &&
             a->lat == b->lat &&
             a->lon == b->lon &&
             a->location_type == b->location_type &&
             a->wheelchair_boarding == b->wheelchair_boarding);
}